

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O2

int xmlidDocTest(char *filename,char *result,char *err,int options)

{
  int iVar1;
  char *__filename;
  int iVar2;
  
  xpathDocument = (xmlDocPtr)xmlReadFile(filename,0,options | 10);
  if (xpathDocument == (xmlDocPtr)0x0) {
    fprintf(_stderr,"Failed to load %s\n",filename);
  }
  else {
    __filename = resultFilename(filename,temp_directory,".res");
    if (__filename == (char *)0x0) {
      fwrite("Out of memory\n",0xe,1,_stderr);
      fatalError();
    }
    xpathOutput = (FILE *)fopen64(__filename,"wb");
    if ((FILE *)xpathOutput != (FILE *)0x0) {
      iVar2 = 0;
      testXPath("id(\'bar\')",0,0);
      fclose((FILE *)xpathOutput);
      if ((result != (char *)0x0) && (iVar1 = compareFiles(__filename,result), iVar1 != 0)) {
        iVar2 = 1;
        fprintf(_stderr,"Result for %s failed in %s\n",filename,result);
      }
      unlink(__filename);
      free(__filename);
      xmlFreeDoc(xpathDocument);
      if (err == (char *)0x0) {
        return iVar2;
      }
      iVar1 = compareFileMem(err,testErrors,testErrorsSize);
      if (iVar1 == 0) {
        return iVar2;
      }
      fprintf(_stderr,"Error for %s failed\n",filename);
      return 1;
    }
    fprintf(_stderr,"failed to open output file %s\n",__filename);
    xmlFreeDoc(xpathDocument);
    free(__filename);
  }
  return -1;
}

Assistant:

static int
xmlidDocTest(const char *filename,
             const char *result,
             const char *err,
             int options) {

    int res = 0;
    int ret = 0;
    char *temp;

    xpathDocument = xmlReadFile(filename, NULL,
                                options | XML_PARSE_DTDATTR | XML_PARSE_NOENT);
    if (xpathDocument == NULL) {
        fprintf(stderr, "Failed to load %s\n", filename);
	return(-1);
    }

    temp = resultFilename(filename, temp_directory, ".res");
    if (temp == NULL) {
        fprintf(stderr, "Out of memory\n");
        fatalError();
    }
    xpathOutput = fopen(temp, "wb");
    if (xpathOutput == NULL) {
	fprintf(stderr, "failed to open output file %s\n", temp);
        xmlFreeDoc(xpathDocument);
        free(temp);
	return(-1);
    }

    testXPath("id('bar')", 0, 0);

    fclose(xpathOutput);
    if (result != NULL) {
	ret = compareFiles(temp, result);
	if (ret) {
	    fprintf(stderr, "Result for %s failed in %s\n", filename, result);
	    res = 1;
	}
    }

    if (temp != NULL) {
        unlink(temp);
        free(temp);
    }
    xmlFreeDoc(xpathDocument);

    if (err != NULL) {
	ret = compareFileMem(err, testErrors, testErrorsSize);
	if (ret != 0) {
	    fprintf(stderr, "Error for %s failed\n", filename);
	    res = 1;
	}
    }
    return(res);
}